

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_bbdpre.c
# Opt level: O0

int IDABBDPrecGetWorkSpace(void *ida_mem,long *lenrwBBDP,long *leniwBBDP)

{
  long lVar1;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  IDAMem in_RDI;
  IBBDPrecData pdata;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  int local_4;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-1,0x168,"IDABBDPrecGetWorkSpace",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_bbdpre.c"
                    ,"Integrator memory is NULL.");
    local_4 = -1;
  }
  else if (in_RDI->ida_lmem == (void *)0x0) {
    IDAProcessError(in_RDI,-2,0x170,"IDABBDPrecGetWorkSpace",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_bbdpre.c"
                    ,
                    "Linear solver memory is NULL. One of the SPILS linear solvers must be attached."
                   );
    local_4 = -2;
  }
  else if (*(long *)((long)in_RDI->ida_lmem + 0x118) == 0) {
    IDAProcessError(in_RDI,-5,0x178,"IDABBDPrecGetWorkSpace",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_bbdpre.c"
                    ,"BBD peconditioner memory is NULL. IDABBDPrecInit must be called.");
    local_4 = -5;
  }
  else {
    lVar1 = *(long *)((long)in_RDI->ida_lmem + 0x118);
    *in_RSI = *(undefined8 *)(lVar1 + 0x80);
    *in_RDX = *(undefined8 *)(lVar1 + 0x88);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int IDABBDPrecGetWorkSpace(void* ida_mem, long int* lenrwBBDP, long int* leniwBBDP)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  IBBDPrecData pdata;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDALS_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_NULL);
    return (IDALS_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  if (IDA_mem->ida_lmem == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_LMEM_NULL, __LINE__, __func__, __FILE__,
                    MSGBBD_LMEM_NULL);
    return (IDALS_LMEM_NULL);
  }
  idals_mem = (IDALsMem)IDA_mem->ida_lmem;

  if (idals_mem->pdata == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_PMEM_NULL, __LINE__, __func__, __FILE__,
                    MSGBBD_PMEM_NULL);
    return (IDALS_PMEM_NULL);
  }
  pdata = (IBBDPrecData)idals_mem->pdata;

  *lenrwBBDP = pdata->rpwsize;
  *leniwBBDP = pdata->ipwsize;

  return (IDALS_SUCCESS);
}